

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v6::detail::report_error(format_func func,int error_code,string_view message)

{
  memory_buffer full_message;
  buffer<char> local_220;
  char local_200 [504];
  
  local_220.ptr_ = local_200;
  local_220.size_ = 0;
  local_220._vptr_buffer = (_func_int **)&PTR_grow_00114b48;
  local_220.capacity_ = 500;
  (*func)(&local_220,error_code,message);
  report_error();
  return;
}

Assistant:

FMT_FUNC void report_error(format_func func, int error_code,
                           string_view message) FMT_NOEXCEPT {
  memory_buffer full_message;
  func(full_message, error_code, message);
  // Don't use fwrite_fully because the latter may throw.
  (void)std::fwrite(full_message.data(), full_message.size(), 1, stderr);
  std::fputc('\n', stderr);
}